

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

double procrustesError<float>(Vec3<float> *from,Vec3<float> *to,float *weights,size_t n,M44d *xform)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (n != 0) {
    lVar1 = 2;
    sVar2 = 0;
    dVar7 = 0.0;
    dVar8 = 0.0;
    do {
      dVar6 = (double)*(float *)((long)from + lVar1 * 4 + -8);
      dVar5 = (double)*(float *)((long)from + lVar1 * 4 + -4);
      dVar9 = (double)(&from->x)[lVar1];
      dVar10 = dVar9 * xform->x[2][3] + dVar6 * xform->x[0][3] + dVar5 * xform->x[1][3] +
               xform->x[3][3];
      dVar3 = (dVar9 * xform->x[2][0] + dVar6 * xform->x[0][0] + xform->x[1][0] * dVar5 +
              xform->x[3][0]) / dVar10 - (double)*(float *)((long)to + lVar1 * 4 + -8);
      dVar4 = (dVar9 * xform->x[2][1] + dVar6 * xform->x[0][1] + xform->x[1][1] * dVar5 +
              xform->x[3][1]) / dVar10 - (double)*(float *)((long)to + lVar1 * 4 + -4);
      dVar5 = (dVar9 * xform->x[2][2] + dVar6 * xform->x[0][2] + dVar5 * xform->x[1][2] +
              xform->x[3][2]) / dVar10 - (double)(&to->x)[lVar1];
      dVar7 = (dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4) * (double)weights[sVar2] - dVar7;
      dVar3 = dVar8 + dVar7;
      dVar7 = (dVar3 - dVar8) - dVar7;
      sVar2 = sVar2 + 1;
      lVar1 = lVar1 + 3;
      dVar8 = dVar3;
    } while (n != sVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

double
procrustesError (const IMATH_INTERNAL_NAMESPACE::Vec3<T>* from,
                 const IMATH_INTERNAL_NAMESPACE::Vec3<T>* to,
                 const T* weights,
                 const size_t n,
                 const IMATH_INTERNAL_NAMESPACE::M44d& xform)
{
    double result = 0.0;
    double residual = 0.0;
    for (size_t i = 0; i < n; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d xformed = IMATH_INTERNAL_NAMESPACE::V3d(from[i]) * xform;
        IMATH_INTERNAL_NAMESPACE::V3d diff = xformed - IMATH_INTERNAL_NAMESPACE::V3d(to[i]);
        const double w = weights[i];
        const double mag = w * diff.length2();

        // Use Kahan summation for the heck of it:
        const double y = mag - residual;
        const double t = result + y;
        residual = (t - result) - y;
        result = t;
    }
    return result;
}